

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

MQTTErrors mqtt_reconnect(mqtt_client *client)

{
  MQTTErrors MVar1;
  
  MVar1 = mqtt_disconnect(client);
  if (MVar1 == MQTT_OK) {
    pthread_mutex_lock((pthread_mutex_t *)&client->mutex);
    client->error = MQTT_ERROR_RECONNECTING;
    pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
  }
  return MVar1;
}

Assistant:

enum MQTTErrors mqtt_reconnect(struct mqtt_client *client)
{
    enum MQTTErrors err = mqtt_disconnect(client);

    if (err == MQTT_OK) {
        MQTT_PAL_MUTEX_LOCK(&client->mutex);
        client->error = MQTT_ERROR_RECONNECTING;
        MQTT_PAL_MUTEX_UNLOCK(&client->mutex);
    }
    return err;
}